

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_bson_string<int>
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,int len,string_t *result)

{
  long *plVar1;
  bool bVar2;
  char_int_type cVar3;
  int_type_conflict iVar4;
  void *in_RDX;
  int in_ESI;
  char (*in_RDI) [38];
  string last_token;
  undefined4 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed6;
  byte bVar5;
  undefined1 in_stack_fffffffffffffed7;
  undefined8 in_stack_fffffffffffffed8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  allocator<char> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  input_format_t in_stack_ffffffffffffff34;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffff38;
  string local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [40];
  string local_40 [32];
  undefined4 in_stack_ffffffffffffffe8;
  char (*byte_) [38];
  int in_stack_fffffffffffffffc;
  
  if (in_ESI < 1) {
    byte_ = in_RDI;
    get_token_string((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                      *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(*in_RDI + 0x18)
    ;
    plVar1 = *(long **)(in_RDI[1] + 2);
    std::__cxx11::to_string(in_stack_ffffffffffffff1c);
    concat<std::__cxx11::string,char_const(&)[38],std::__cxx11::string>(in_RDI,args_1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    exception_message(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                      in_stack_ffffffffffffff20);
    parse_error::create<std::nullptr_t,_0>
              (in_stack_fffffffffffffffc,(size_t)byte_,
               (string *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
    bVar5 = (**(code **)(*plVar1 + 0x60))(plVar1,args_1,local_40,local_68);
    bVar5 = bVar5 & 1;
    parse_error::~parse_error((parse_error *)0x26e505);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    std::__cxx11::string::~string(local_40);
  }
  else {
    bVar2 = get_string<int>(in_stack_fffffffffffffee0,
                            (input_format_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                            (int)in_stack_fffffffffffffed8,
                            (string_t *)
                            CONCAT17(in_stack_fffffffffffffed7,
                                     CONCAT16(in_stack_fffffffffffffed6,
                                              CONCAT24(in_stack_fffffffffffffed4,
                                                       in_stack_fffffffffffffed0))));
    bVar5 = 0;
    if (bVar2) {
      cVar3 = get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                   *)CONCAT17(in_stack_fffffffffffffed7,
                              (uint7)CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)))
      ;
      iVar4 = std::char_traits<char>::eof();
      bVar5 = cVar3 != iVar4;
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool get_bson_string(const NumberType len, string_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(len < 1))
        {
            auto last_token = get_token_string();
            return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read,
                                    exception_message(input_format_t::bson, concat("string length must be at least 1, is ", std::to_string(len)), "string"), nullptr));
        }

        return get_string(input_format_t::bson, len - static_cast<NumberType>(1), result) && get() != char_traits<char_type>::eof();
    }